

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Object *pOVar1;
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"C",&local_29);
  pOVar1 = Object::CreateObject(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (pOVar1 != (Object *)0x0) {
    (*pOVar1->_vptr_Object[1])(pOVar1);
  }
  return 0;
}

Assistant:

int main()
{
    Object* obj = Object::CreateObject("C");
    delete obj;
    return 0;
}